

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O1

void embree::AccelN::occluded16
               (void *valid,Intersectors *This_in,RTCRay16 *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pAVar1 = This_in->ptr;
  lVar6 = *(long *)&pAVar1[3].type;
  if (*(long *)&pAVar1[3].field_0x58 != lVar6) {
    uVar7 = 0;
    do {
      lVar6 = *(long *)(lVar6 + uVar7 * 8);
      if (*(float *)(lVar6 + 0x10) < INFINITY) {
        uVar4 = (**(code **)(lVar6 + 0x130))(valid,lVar6 + 0x58,ray,context);
        auVar8._0_4_ = -(uint)(0.0 <= ray->tfar[4]) & *(uint *)((long)valid + 0x10);
        auVar8._4_4_ = -(uint)(0.0 <= ray->tfar[5]) & *(uint *)((long)valid + 0x14);
        auVar8._8_4_ = -(uint)(0.0 <= ray->tfar[6]) & *(uint *)((long)valid + 0x18);
        auVar8._12_4_ = -(uint)(0.0 <= ray->tfar[7]) & *(uint *)((long)valid + 0x1c);
        auVar2._4_4_ = -(uint)(0.0 <= ray->tfar[1]) & *(uint *)((long)valid + 4);
        auVar2._0_4_ = -(uint)(0.0 <= ray->tfar[0]) & *valid;
        auVar2._8_4_ = -(uint)(0.0 <= ray->tfar[2]) & *(uint *)((long)valid + 8);
        auVar2._12_4_ = -(uint)(0.0 <= ray->tfar[3]) & *(uint *)((long)valid + 0xc);
        auVar9._0_4_ = -(uint)(0.0 <= ray->tfar[0xc]) & *(uint *)((long)valid + 0x30);
        auVar9._4_4_ = -(uint)(0.0 <= ray->tfar[0xd]) & *(uint *)((long)valid + 0x34);
        auVar9._8_4_ = -(uint)(0.0 <= ray->tfar[0xe]) & *(uint *)((long)valid + 0x38);
        auVar9._12_4_ = -(uint)(0.0 <= ray->tfar[0xf]) & *(uint *)((long)valid + 0x3c);
        auVar3._4_4_ = -(uint)(0.0 <= ray->tfar[9]) & *(uint *)((long)valid + 0x24);
        auVar3._0_4_ = -(uint)(0.0 <= ray->tfar[8]) & *(uint *)((long)valid + 0x20);
        auVar3._8_4_ = -(uint)(0.0 <= ray->tfar[10]) & *(uint *)((long)valid + 0x28);
        auVar3._12_4_ = -(uint)(0.0 <= ray->tfar[0xb]) & *(uint *)((long)valid + 0x2c);
        iVar5 = movmskps(uVar4,auVar9 | auVar3 | auVar8 | auVar2);
        if (iVar5 == 0) {
          return;
        }
      }
      uVar7 = uVar7 + 1;
      lVar6 = *(long *)&pAVar1[3].type;
    } while (uVar7 < (ulong)(*(long *)&pAVar1[3].field_0x58 - lVar6 >> 3));
  }
  return;
}

Assistant:

void AccelN::occluded16 (const void* valid, Accel::Intersectors* This_in, RTCRay16& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++) {
      if (This->accels[i]->isEmpty()) continue;
      This->accels[i]->intersectors.occluded16(valid,ray,context);
#if defined(__SSE2__) || defined(__ARM_NEON) // FIXME: use higher ISA
      vbool4 valid0 = asBool(((vint4*)valid)[0]);
      vbool4 hit0   = ((vfloat4*)ray.tfar)[0] >= vfloat4(zero);
      vbool4 valid1 = asBool(((vint4*)valid)[1]);
      vbool4 hit1   = ((vfloat4*)ray.tfar)[1] >= vfloat4(zero);
      vbool4 valid2 = asBool(((vint4*)valid)[2]);
      vbool4 hit2   = ((vfloat4*)ray.tfar)[2] >= vfloat4(zero);
      vbool4 valid3 = asBool(((vint4*)valid)[3]);
      vbool4 hit3   = ((vfloat4*)ray.tfar)[3] >= vfloat4(zero);
      if (unlikely((none((valid0 & hit0) | (valid1 & hit1) | (valid2 & hit2) | (valid3 & hit3))))) break;
#endif
    }
  }